

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

int32_t icu_63::PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex,int32_t value)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  
  if (valueMapIndex != 0) {
    iVar6 = valueMapIndex + 2;
    uVar3 = (ulong)valueMapIndex;
    iVar4 = *(int *)(valueMaps + uVar3 * 4 + 4);
    if (iVar4 < 0x10) {
      if (0 < iVar4) {
        iVar4 = iVar4 + 1;
        do {
          lVar9 = (long)iVar6;
          iVar1 = *(int *)(valueMaps + lVar9 * 4);
          iVar6 = iVar6 + 2;
          iVar5 = 2;
          if (iVar1 <= value) {
            if (value < *(int *)(valueMaps + lVar9 * 4 + 4)) {
              uVar3 = (ulong)*(uint *)(valueMaps + (long)((iVar6 + value) - iVar1) * 4);
              iVar5 = 1;
            }
            else {
              iVar6 = (iVar6 - iVar1) + *(int *)(valueMaps + lVar9 * 4 + 4);
              iVar5 = 0;
            }
          }
          if (iVar5 != 0) {
            if (iVar5 == 2) {
              return 0;
            }
            return (int32_t)uVar3;
          }
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
    }
    else {
      iVar4 = iVar4 + valueMapIndex + -0xe;
      lVar9 = (long)iVar6;
      lVar7 = (long)iVar4;
      piVar8 = (int *)(valueMaps + lVar9 * 4);
      do {
        iVar6 = 0;
        if (value < *piVar8) {
          iVar6 = 5;
LAB_0031f6fb:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (*piVar8 == value) {
            uVar3 = (ulong)*(uint *)(valueMaps + (long)iVar4 * 4);
            iVar6 = 1;
            goto LAB_0031f6fb;
          }
        }
        if (iVar6 != 0) {
          if (iVar6 == 5) {
            return 0;
          }
          if (bVar2) {
            return 0;
          }
          return (int32_t)uVar3;
        }
        lVar9 = lVar9 + 1;
        iVar4 = iVar4 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar9 < lVar7);
    }
  }
  return 0;
}

Assistant:

int32_t PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex, int32_t value) {
    if(valueMapIndex==0) {
        return 0;  // The property does not have named values.
    }
    ++valueMapIndex;  // Skip the BytesTrie offset.
    int32_t numRanges=valueMaps[valueMapIndex++];
    if(numRanges<0x10) {
        // Ranges of values.
        for(; numRanges>0; --numRanges) {
            // Read and skip the start and limit of this range.
            int32_t start=valueMaps[valueMapIndex];
            int32_t limit=valueMaps[valueMapIndex+1];
            valueMapIndex+=2;
            if(value<start) {
                break;
            }
            if(value<limit) {
                return valueMaps[valueMapIndex+value-start];
            }
            valueMapIndex+=limit-start;  // Skip all entries for this range.
        }
    } else {
        // List of values.
        int32_t valuesStart=valueMapIndex;
        int32_t nameGroupOffsetsStart=valueMapIndex+numRanges-0x10;
        do {
            int32_t v=valueMaps[valueMapIndex];
            if(value<v) {
                break;
            }
            if(value==v) {
                return valueMaps[nameGroupOffsetsStart+valueMapIndex-valuesStart];
            }
        } while(++valueMapIndex<nameGroupOffsetsStart);
    }
    return 0;
}